

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O3

void reader_deinit(FileReader reader)

{
  uint uVar1;
  pthread_t *ppVar2;
  long lVar3;
  FileReaderImpl *impl;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  if (reader == (FileReader)0x0) {
    _mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl","reader_deinit",0x15f);
    if ((DAT_001142fb & 0x10) != 0) {
      abort();
    }
    LOCK();
    bVar6 = _DAT_00000060 == 0;
    if (bVar6) {
      _DAT_00000060 = 1;
    }
    UNLOCK();
    ppVar2 = (pthread_t *)&DAT_00000058;
    if (!bVar6) goto LAB_0010686e;
  }
  else {
    LOCK();
    bVar6 = *(int *)((long)reader + 0x60) == 0;
    if (bVar6) {
      *(int *)((long)reader + 0x60) = 1;
    }
    UNLOCK();
    if (!bVar6) goto LAB_0010686e;
    ppVar2 = (pthread_t *)((long)reader + 0x58);
  }
  pthread_join(*ppVar2,(void **)0x0);
LAB_0010686e:
  if (*reader != (FILE *)0x0) {
    fclose(*reader);
    *(undefined8 *)reader = 0;
  }
  uVar1 = *(uint *)((long)reader + 0x68);
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      lVar5 = *(long *)(*(long *)((long)reader + 0x70) + uVar4 * 8);
      if (lVar5 != 0) {
        if (*(long *)(lVar5 + 8) == 0) {
LAB_001068c6:
          mpp_osal_free("reader_deinit",lVar5);
          lVar3 = *(long *)((long)reader + 0x70);
        }
        else {
          mpp_buffer_put_with_caller(*(long *)(lVar5 + 8),"reader_deinit");
          *(undefined8 *)(lVar5 + 8) = 0;
          lVar3 = *(long *)((long)reader + 0x70);
          lVar5 = *(long *)(lVar3 + uVar4 * 8);
          if (lVar5 != 0) goto LAB_001068c6;
        }
        *(undefined8 *)(lVar3 + uVar4 * 8) = 0;
        uVar1 = *(uint *)((long)reader + 0x68);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar1);
  }
  if (*(long *)((long)reader + 0x50) != 0) {
    mpp_buffer_group_put();
    *(undefined8 *)((long)reader + 0x50) = 0;
  }
  if (*(long *)((long)reader + 0x70) != 0) {
    mpp_osal_free("reader_deinit");
  }
  *(undefined8 *)((long)reader + 0x70) = 0;
  mpp_osal_free("reader_deinit",reader);
  return;
}

Assistant:

void reader_deinit(FileReader reader)
{
    FileReaderImpl *impl = (FileReaderImpl*)(reader);
    RK_U32 i;

    mpp_assert(impl);
    reader_stop(impl);

    if (impl->fp_input) {
        fclose(impl->fp_input);
        impl->fp_input = NULL;
    }

    for (i = 0; i < impl->slot_cnt; i++) {
        FileBufSlot *slot = impl->slots[i];
        if (!slot)
            continue;

        if (slot->buf) {
            mpp_buffer_put(slot->buf);
            slot->buf = NULL;
        }
        MPP_FREE(impl->slots[i]);
    }

    if (impl->group) {
        mpp_buffer_group_put(impl->group);
        impl->group = NULL;
    }

    MPP_FREE(impl->slots);
    MPP_FREE(impl);
}